

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2ImageMap(LWOImporter *this,uint size,Texture *tex)

{
  uint *puVar1;
  char cVar2;
  ushort uVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  Logger *this_00;
  runtime_error *this_01;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint *puVar10;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string *local_40;
  Texture *local_38;
  
  if (6 < size) {
    puVar4 = (uint *)this->mFileBuffer;
    puVar10 = (uint *)((long)puVar4 + 6);
    local_40 = (string *)&tex->mUVChannelIndex;
    puVar6 = puVar4;
    local_38 = tex;
    do {
      uVar9 = *puVar6;
      this->mFileBuffer = (uint8_t *)(puVar6 + 1);
      uVar5 = puVar6[1];
      this->mFileBuffer = (uint8_t *)puVar10;
      uVar8 = (ulong)(ushort)((ushort)uVar5 << 8 | (ushort)uVar5 >> 8);
      puVar1 = (uint *)(uVar8 + (long)puVar10);
      if ((uint *)((ulong)size + (long)puVar4) < puVar1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"LWO2: Invalid SURF.BLOCK chunk length","");
        std::runtime_error::runtime_error(this_01,(string *)local_60);
        *(undefined ***)this_01 = &PTR__runtime_error_008dc448;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      if ((int)uVar9 < 0x564d4150) {
        if (uVar9 == 0x41584953) {
          uVar9 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar6 + 2);
          tex->majorAxis = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
        }
        else if (uVar9 == 0x494d4147) {
          uVar9 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar6 + 2);
          tex->mClipIdx = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
        }
        else if (uVar9 == 0x50524f4a) {
          uVar9 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar6 + 2);
          tex->mapMode = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
        }
      }
      else if ((int)uVar9 < 0x57525048) {
        if (uVar9 == 0x564d4150) {
          cVar2 = (char)*puVar10;
          puVar6 = puVar10;
          while (cVar2 != '\0') {
            puVar6 = (uint *)((long)puVar6 + 1);
            iVar7 = (int)uVar8;
            uVar8 = (ulong)(iVar7 - 1);
            if (iVar7 == 0) {
              this_00 = DefaultLogger::get();
              Logger::warn(this_00,"LWO: Invalid file, string is is too long");
              puVar6 = (uint *)this->mFileBuffer;
              break;
            }
            this->mFileBuffer = (uint8_t *)puVar6;
            cVar2 = *(char *)puVar6;
          }
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,puVar10,puVar6);
          std::__cxx11::string::operator=(local_40,(string *)local_60);
          if (local_60[0] != local_50) {
            operator_delete(local_60[0]);
          }
          this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar6 - (int)puVar10 & 1));
          tex = local_38;
        }
        else if (uVar9 == 0x57524150) {
          uVar9 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar6 + 2);
          tex->wrapModeWidth = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
          uVar3 = *(ushort *)this->mFileBuffer;
          this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 2);
          tex->wrapModeHeight = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        }
      }
      else if (uVar9 == 0x57525048) {
        uVar9 = *puVar10;
        this->mFileBuffer = (uint8_t *)((long)puVar6 + 10);
        tex->wrapAmountH =
             (float)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18
                    );
      }
      else if (uVar9 == 0x57525057) {
        uVar9 = *puVar10;
        this->mFileBuffer = (uint8_t *)((long)puVar6 + 10);
        tex->wrapAmountW =
             (float)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18
                    );
      }
      this->mFileBuffer = (uint8_t *)puVar1;
      puVar10 = (uint *)((long)puVar1 + 6);
      puVar6 = puVar1;
    } while (puVar10 < (uint *)((ulong)size + (long)puVar4));
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2ImageMap(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid SURF.BLOCK chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_PROJ:
            tex.mapMode = (Texture::MappingMode)GetU2();
            break;
        case AI_LWO_WRAP:
            tex.wrapModeWidth  = (Texture::Wrap)GetU2();
            tex.wrapModeHeight = (Texture::Wrap)GetU2();
            break;
        case AI_LWO_AXIS:
            tex.majorAxis = (Texture::Axes)GetU2();
            break;
        case AI_LWO_IMAG:
            tex.mClipIdx = GetU2();
            break;
        case AI_LWO_VMAP:
            GetS0(tex.mUVChannelIndex,head.length);
            break;
        case AI_LWO_WRPH:
            tex.wrapAmountH = GetF4();
            break;
        case AI_LWO_WRPW:
            tex.wrapAmountW = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}